

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

ScriptFunction *
Js::StackScriptFunction::OP_NewStackScFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,ScriptFunction *stackFunction)

{
  FunctionProxy *this;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  FunctionInfo *pFVar6;
  undefined4 extraout_var;
  ScriptFunction *pSVar7;
  char16 *pcVar8;
  char16_t *pcVar9;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (stackFunction == (ScriptFunction *)0x0) {
    pSVar7 = ScriptFunction::OP_NewScFunc(environment,infoRef);
    return pSVar7;
  }
  this = (infoRef->ptr->functionBodyImpl).ptr;
  if (this == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x2ec,"(functionProxy != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) goto LAB_00beeb1e;
    *puVar4 = 0;
  }
  if ((((stackFunction->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
      functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x2ed,
                                "(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy)"
                                ,
                                "stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy"
                               );
    if (!bVar2) goto LAB_00beeb1e;
    *puVar4 = 0;
  }
  bVar2 = FunctionProxy::IsFunctionBody(this);
  if (bVar2) {
    pFVar5 = FunctionProxy::GetFunctionBody(this);
    pFVar6 = FunctionBody::GetStackNestedFuncParentStrongRef(pFVar5);
    if (pFVar6 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                  ,0x2ee,
                                  "(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr)"
                                  ,
                                  "!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr"
                                 );
      if (!bVar2) {
LAB_00beeb1e:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  ScriptFunction::SetEnvironment(stackFunction,environment);
  sourceContextId = FunctionProxy::GetSourceContextId(this);
  functionId = FunctionProxy::GetLocalFunctionId(this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,StackFuncPhase,sourceContextId,functionId);
  if ((bVar2) && (DAT_0145948a == '\x01')) {
    bVar2 = FunctionProxy::IsFunctionBody(this);
    if (bVar2) {
      pFVar5 = FunctionProxy::GetFunctionBody(this);
      iVar3 = (*(pFVar5->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar5);
      pcVar9 = (char16_t *)CONCAT44(extraout_var,iVar3);
    }
    else {
      pcVar9 = L"<deferred>";
    }
    pcVar8 = FunctionProxy::GetDebugNumberSet(this,(wchar (*) [42])local_88);
    Output::Print(L"Stack alloc nested function: %s %s (address: %p)\n",pcVar9,pcVar8,stackFunction)
    ;
    Output::Flush();
  }
  return stackFunction;
}

Assistant:

ScriptFunction * StackScriptFunction::OP_NewStackScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, ScriptFunction * stackFunction)
    {
        if (stackFunction)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

            FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
            AssertMsg(functionProxy != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
            Assert(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy);
            Assert(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr);
            stackFunction->SetEnvironment(environment);


            PHASE_PRINT_VERBOSE_TRACE(Js::StackFuncPhase, functionProxy,
                _u("Stack alloc nested function: %s %s (address: %p)\n"),
                    functionProxy->IsFunctionBody()?
                        functionProxy->GetFunctionBody()->GetDisplayName() : _u("<deferred>"),
                        functionProxy->GetDebugNumberSet(debugStringBuffer), stackFunction);
            return stackFunction;
        }
        return ScriptFunction::OP_NewScFunc(environment, infoRef);
    }